

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

void rfc5444_writer_unregister_target(rfc5444_writer *writer,rfc5444_writer_target *interf)

{
  list_entity *plVar1;
  list_entity *plVar2;
  bool bVar3;
  rfc5444_writer_target *interf_local;
  rfc5444_writer *writer_local;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x231,
                  "void rfc5444_writer_unregister_target(struct rfc5444_writer *, struct rfc5444_writer_target *)"
                 );
  }
  bVar3 = false;
  if ((interf->_target_node).next != (list_entity *)0x0) {
    bVar3 = (interf->_target_node).prev != (list_entity *)0x0;
  }
  if (bVar3) {
    plVar1 = (interf->_target_node).prev;
    plVar2 = (interf->_target_node).next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (interf->_target_node).prev = (list_entity *)0x0;
    (interf->_target_node).next = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
rfc5444_writer_unregister_target(
  struct rfc5444_writer *writer __attribute__((unused)), struct rfc5444_writer_target *interf) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  /* remove interface from writer */
  if (list_is_node_added(&interf->_target_node)) {
    list_remove(&interf->_target_node);
  }
}